

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshio.cpp
# Opt level: O0

vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
* geometrycentral::surface::anon_unknown_19::paramToStdVector
            (SurfaceMesh *mesh,CornerData<Vector2> *param)

{
  Corner e;
  bool bVar1;
  undefined1 uVar2;
  size_t sVar3;
  SurfaceMesh *in_RSI;
  vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
  *in_RDI;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> EVar4;
  Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh> EVar5;
  Corner c;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentCornerNavigator> __end3;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentCornerNavigator> __begin3;
  NavigationSetBase<geometrycentral::surface::FaceAdjacentCornerNavigator> *__range3;
  Face f;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __begin2;
  FaceSet *__range2;
  size_t i;
  vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
  *uv;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> *in_stack_fffffffffffffe88;
  SurfaceMesh *in_stack_fffffffffffffe90;
  size_t in_stack_fffffffffffffe98;
  ParentMeshT *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
  *in_stack_fffffffffffffeb0;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentCornerNavigator> local_f8 [2];
  NavigationSetBase<geometrycentral::surface::FaceAdjacentCornerNavigator> local_c8;
  NavigationSetBase<geometrycentral::surface::FaceAdjacentCornerNavigator> *local_a0;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> local_98;
  undefined1 local_58 [24];
  undefined1 *local_40;
  size_type local_38;
  undefined1 local_19;
  
  local_19 = 0;
  SurfaceMesh::nFaces(in_RSI);
  ::std::
  allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>::
  allocator((allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>
             *)0x20da88);
  ::std::
  vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
  ::vector(in_stack_fffffffffffffeb0,CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
           (allocator_type *)in_stack_fffffffffffffea0);
  ::std::
  allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>::
  ~allocator((allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>
              *)0x20daab);
  local_38 = 0;
  SurfaceMesh::faces(in_stack_fffffffffffffe90);
  local_40 = local_58;
  RangeSetBase<geometrycentral::surface::FaceRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffffe90);
  RangeSetBase<geometrycentral::surface::FaceRangeF>::end
            ((RangeSetBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffffe90);
  EVar5.ind = in_stack_fffffffffffffe98;
  EVar5.mesh = in_stack_fffffffffffffea0;
  while( true ) {
    bVar1 = RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator!=
                      ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)
                       in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    if (!bVar1) break;
    EVar4 = (Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>)
            RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator*
                      ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)0x20db43);
    sVar3 = EVar4.ind;
    local_98 = EVar4;
    Face::adjacentCorners((Face *)EVar5.mesh);
    local_a0 = &local_c8;
    NavigationSetBase<geometrycentral::surface::FaceAdjacentCornerNavigator>::begin
              ((NavigationSetBase<geometrycentral::surface::FaceAdjacentCornerNavigator> *)
               EVar5.mesh);
    NavigationSetBase<geometrycentral::surface::FaceAdjacentCornerNavigator>::end(local_f8,local_a0)
    ;
    while( true ) {
      uVar2 = NavigationIteratorBase<geometrycentral::surface::FaceAdjacentCornerNavigator>::
              operator!=((NavigationIteratorBase<geometrycentral::surface::FaceAdjacentCornerNavigator>
                          *)in_stack_fffffffffffffe90,
                         (NavigationIteratorBase<geometrycentral::surface::FaceAdjacentCornerNavigator>
                          *)in_stack_fffffffffffffe88);
      if (!(bool)uVar2) break;
      EVar5 = (Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>)
              NavigationIteratorBase<geometrycentral::surface::FaceAdjacentCornerNavigator>::
              operator*((NavigationIteratorBase<geometrycentral::surface::FaceAdjacentCornerNavigator>
                         *)0x20dbf5);
      in_stack_fffffffffffffe88 =
           (RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)
           ::std::
           vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
           ::operator[](in_RDI,local_38);
      e.super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>.mesh.
      _7_1_ = uVar2;
      e.super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>.mesh.
      _0_7_ = in_stack_fffffffffffffea8;
      e.super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>.ind =
           sVar3;
      in_stack_fffffffffffffe90 =
           (SurfaceMesh *)
           MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>::operator[]
                     ((MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2> *)
                      EVar5.mesh,e);
      ::std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>::push_back
                ((vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_> *)
                 EVar5.mesh,(value_type *)EVar5.ind);
      NavigationIteratorBase<geometrycentral::surface::FaceAdjacentCornerNavigator>::operator++
                ((NavigationIteratorBase<geometrycentral::surface::FaceAdjacentCornerNavigator> *)
                 in_stack_fffffffffffffe90);
    }
    local_38 = local_38 + 1;
    RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffffe90)
    ;
  }
  return in_RDI;
}

Assistant:

std::vector<std::vector<Vector2>> paramToStdVector(SurfaceMesh& mesh, CornerData<Vector2>& param) {
  std::vector<std::vector<Vector2>> uv(mesh.nFaces());
  size_t i = 0;
  for (Face f : mesh.faces()) {
    for (Corner c : f.adjacentCorners()) {
      uv[i].push_back(param[c]);
    }
    i++;
  }
  return uv;
}